

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding.c
# Opt level: O0

char * xmlGetCharEncodingName(xmlCharEncoding enc)

{
  char *pcStack_10;
  xmlCharEncoding enc_local;
  
  switch(enc) {
  case XML_CHAR_ENCODING_NONE:
    pcStack_10 = (char *)0x0;
    break;
  case XML_CHAR_ENCODING_UTF8:
    pcStack_10 = "UTF-8";
    break;
  case XML_CHAR_ENCODING_UTF16LE:
    pcStack_10 = "UTF-16";
    break;
  case XML_CHAR_ENCODING_UTF16BE:
    pcStack_10 = "UTF-16";
    break;
  case XML_CHAR_ENCODING_UCS4LE:
    pcStack_10 = "ISO-10646-UCS-4";
    break;
  case XML_CHAR_ENCODING_UCS4BE:
    pcStack_10 = "ISO-10646-UCS-4";
    break;
  case XML_CHAR_ENCODING_EBCDIC:
    pcStack_10 = "EBCDIC";
    break;
  case XML_CHAR_ENCODING_UCS4_2143:
    pcStack_10 = "ISO-10646-UCS-4";
    break;
  case XML_CHAR_ENCODING_UCS4_3412:
    pcStack_10 = "ISO-10646-UCS-4";
    break;
  case XML_CHAR_ENCODING_UCS2:
    pcStack_10 = "ISO-10646-UCS-2";
    break;
  case XML_CHAR_ENCODING_8859_1:
    pcStack_10 = "ISO-8859-1";
    break;
  case XML_CHAR_ENCODING_8859_2:
    pcStack_10 = "ISO-8859-2";
    break;
  case XML_CHAR_ENCODING_8859_3:
    pcStack_10 = "ISO-8859-3";
    break;
  case XML_CHAR_ENCODING_8859_4:
    pcStack_10 = "ISO-8859-4";
    break;
  case XML_CHAR_ENCODING_8859_5:
    pcStack_10 = "ISO-8859-5";
    break;
  case XML_CHAR_ENCODING_8859_6:
    pcStack_10 = "ISO-8859-6";
    break;
  case XML_CHAR_ENCODING_8859_7:
    pcStack_10 = "ISO-8859-7";
    break;
  case XML_CHAR_ENCODING_8859_8:
    pcStack_10 = "ISO-8859-8";
    break;
  case XML_CHAR_ENCODING_8859_9:
    pcStack_10 = "ISO-8859-9";
    break;
  case XML_CHAR_ENCODING_2022_JP:
    pcStack_10 = "ISO-2022-JP";
    break;
  case XML_CHAR_ENCODING_SHIFT_JIS:
    pcStack_10 = "Shift-JIS";
    break;
  case XML_CHAR_ENCODING_EUC_JP:
    pcStack_10 = "EUC-JP";
    break;
  case XML_CHAR_ENCODING_ASCII:
    pcStack_10 = (char *)0x0;
    break;
  case XML_CHAR_ENCODING_ERROR:
    pcStack_10 = (char *)0x0;
    break;
  default:
    pcStack_10 = (char *)0x0;
  }
  return pcStack_10;
}

Assistant:

const char*
xmlGetCharEncodingName(xmlCharEncoding enc) {
    switch (enc) {
        case XML_CHAR_ENCODING_ERROR:
	    return(NULL);
        case XML_CHAR_ENCODING_NONE:
	    return(NULL);
        case XML_CHAR_ENCODING_UTF8:
	    return("UTF-8");
        case XML_CHAR_ENCODING_UTF16LE:
	    return("UTF-16");
        case XML_CHAR_ENCODING_UTF16BE:
	    return("UTF-16");
        case XML_CHAR_ENCODING_EBCDIC:
            return("EBCDIC");
        case XML_CHAR_ENCODING_UCS4LE:
            return("ISO-10646-UCS-4");
        case XML_CHAR_ENCODING_UCS4BE:
            return("ISO-10646-UCS-4");
        case XML_CHAR_ENCODING_UCS4_2143:
            return("ISO-10646-UCS-4");
        case XML_CHAR_ENCODING_UCS4_3412:
            return("ISO-10646-UCS-4");
        case XML_CHAR_ENCODING_UCS2:
            return("ISO-10646-UCS-2");
        case XML_CHAR_ENCODING_8859_1:
	    return("ISO-8859-1");
        case XML_CHAR_ENCODING_8859_2:
	    return("ISO-8859-2");
        case XML_CHAR_ENCODING_8859_3:
	    return("ISO-8859-3");
        case XML_CHAR_ENCODING_8859_4:
	    return("ISO-8859-4");
        case XML_CHAR_ENCODING_8859_5:
	    return("ISO-8859-5");
        case XML_CHAR_ENCODING_8859_6:
	    return("ISO-8859-6");
        case XML_CHAR_ENCODING_8859_7:
	    return("ISO-8859-7");
        case XML_CHAR_ENCODING_8859_8:
	    return("ISO-8859-8");
        case XML_CHAR_ENCODING_8859_9:
	    return("ISO-8859-9");
        case XML_CHAR_ENCODING_2022_JP:
            return("ISO-2022-JP");
        case XML_CHAR_ENCODING_SHIFT_JIS:
            return("Shift-JIS");
        case XML_CHAR_ENCODING_EUC_JP:
            return("EUC-JP");
	case XML_CHAR_ENCODING_ASCII:
	    return(NULL);
    }
    return(NULL);
}